

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O0

int Io_ReadPlaMergeDistance1(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  int iVar1;
  int local_30;
  int Counter;
  int Res;
  int c2;
  int c1;
  Vec_Bit_t *vMarks_local;
  int nWords_local;
  int nCubes_local;
  word **pCs_local;
  
  local_30 = 0;
  Vec_BitFill(vMarks,nCubes,0);
  Res = 0;
  do {
    if (nCubes <= Res) {
      return local_30;
    }
    iVar1 = Vec_BitEntry(vMarks,Res);
    Counter = Res;
    if (iVar1 == 0) {
      do {
        Counter = Counter + 1;
        if (nCubes <= Counter) goto LAB_003526e1;
        iVar1 = Vec_BitEntry(vMarks,Counter);
      } while ((iVar1 != 0) ||
              (iVar1 = Io_ReadPlaDistance1(pCs[Res],pCs[Counter],nWords), iVar1 == 0));
      Abc_TtAnd(pCs[Res],pCs[Res],pCs[Counter],nWords,0);
      Vec_BitWriteEntry(vMarks,Counter,1);
      local_30 = local_30 + 1;
    }
LAB_003526e1:
    Res = Res + 1;
  } while( true );
}

Assistant:

int Io_ReadPlaMergeDistance1( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaDistance1( pCs[c1], pCs[c2], nWords );
                    if ( !Res )
                        continue;
                    Abc_TtAnd( pCs[c1], pCs[c1], pCs[c2], nWords, 0 );
                    Vec_BitWriteEntry( vMarks, c2, 1 );
                    Counter++;
                    break;
                }
    return Counter;
}